

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void add_token(VARR_token_t *to,token_t t)

{
  size_t sVar1;
  token_t ptVar2;
  
  if ((*(short *)t == 0x20) || (*(short *)t == 10)) {
    sVar1 = VARR_token_tlength(to);
    if (sVar1 != 0) {
      ptVar2 = VARR_token_tlast(to);
      if (*(short *)ptVar2 != 0x20) {
        ptVar2 = VARR_token_tlast(to);
        if (*(short *)ptVar2 != 10) goto LAB_00163321;
      }
      return;
    }
  }
LAB_00163321:
  VARR_token_tpush(to,t);
  return;
}

Assistant:

static void add_token (VARR (token_t) * to, token_t t) {
  if ((t->code != ' ' && t->code != '\n') || VARR_LENGTH (token_t, to) == 0
      || (VARR_LAST (token_t, to)->code != ' ' && VARR_LAST (token_t, to)->code != '\n'))
    VARR_PUSH (token_t, to, t);
}